

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_StopAfterSyntaxIdentifier_Test::TestBody
          (ParserTest_StopAfterSyntaxIdentifier_Test *this)

{
  bool bVar1;
  pointer pPVar2;
  pointer input;
  char *pcVar3;
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  *this_00;
  char *in_R9;
  AssertHelper local_c8;
  Message local_c0;
  string_view local_b8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  ParserTest_StopAfterSyntaxIdentifier_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "// blah\nsyntax = \"foobar\";\nthis line will not be parsed\n");
  ParserTest::SetupParser(&this->super_ParserTest,stack0xffffffffffffffe0);
  this_00 = &(this->super_ParserTest).parser_;
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(this_00);
  Parser::SetStopAfterSyntaxIdentifier(pPVar2,true);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(this_00);
  input = std::
          unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
          ::get(&(this->super_ParserTest).input_);
  local_31 = Parser::Parse(pPVar2,input,(FileDescriptorProto *)0x0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_30,
               (AssertionResult *)"parser_->Parse(input_.get(), nullptr)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_88,"\"\"","error_collector_.text_",
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5),
             &(this->super_ParserTest).error_collector_.text_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(&(this->super_ParserTest).parser_);
  local_b8 = Parser::GetSyntaxIdentifier(pPVar2);
  testing::internal::EqHelper::
  Compare<char[7],_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_a8,"\"foobar\"","parser_->GetSyntaxIdentifier()",
             (char (*) [7])"foobar",&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F(ParserTest, StopAfterSyntaxIdentifier) {
  SetupParser(
      "// blah\n"
      "syntax = \"foobar\";\n"
      "this line will not be parsed\n");
  parser_->SetStopAfterSyntaxIdentifier(true);
  EXPECT_TRUE(parser_->Parse(input_.get(), nullptr));
  EXPECT_EQ("", error_collector_.text_);
  EXPECT_EQ("foobar", parser_->GetSyntaxIdentifier());
}